

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O1

void __thiscall
jwt::algorithm::rsa::rsa
          (rsa *this,string *public_key,string *private_key,string *public_key_password,
          string *private_key_password,_func_EVP_MD_ptr *md,string *name)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  runtime_error *this_01;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  (this->pkey).super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pkey).super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->md = md;
  local_38 = &(this->alg_name).field_2;
  (this->alg_name)._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->alg_name,pcVar1,pcVar1 + name->_M_string_length);
  if (private_key->_M_string_length == 0) {
    if (public_key->_M_string_length == 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_01,"at least one of public or private key need to be present");
      *(undefined ***)this_01 = &PTR__runtime_error_00113bd8;
      __cxa_throw(this_01,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
    }
    helper::load_public_key_from_string((helper *)&local_48,public_key,public_key_password);
  }
  else {
    helper::load_private_key_from_string((helper *)&local_48,private_key,private_key_password);
  }
  p_Var3 = p_Stack_40;
  peVar2 = local_48;
  local_48 = (element_type *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->pkey).super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->pkey).super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->pkey).super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  return;
}

Assistant:

rsa(const std::string& public_key, const std::string& private_key, const std::string& public_key_password, const std::string& private_key_password, const EVP_MD*(*md)(), const std::string& name)
				: md(md), alg_name(name)
			{
				if (!private_key.empty()) {
					pkey = helper::load_private_key_from_string(private_key, private_key_password);
				} else if(!public_key.empty()) {
					pkey = helper::load_public_key_from_string(public_key, public_key_password);
				} else
					throw rsa_exception("at least one of public or private key need to be present");
			}